

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearDualBounds(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Status stat,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *upp,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *lw)

{
  ulong *puVar1;
  cpp_dec_float<100U,_int,_void> *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  undefined4 in_stack_fffffffffffffdc8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffdd0;
  double in_stack_fffffffffffffdd8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffde0;
  undefined1 local_1d8 [80];
  ulong local_188;
  undefined1 local_180 [80];
  undefined1 local_130 [80];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  ulong *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  undefined8 local_18;
  ulong *local_10;
  undefined8 local_8;
  
  local_e0 = in_RCX;
  local_d8 = in_RDX;
  if (in_ESI == -6) {
LAB_0051f112:
    local_b8 = infinity();
    local_b0 = local_130;
    local_c0 = 0;
    local_8 = local_b8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    local_28 = local_d8;
    local_30 = local_130;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffdd0,
               (cpp_dec_float<100U,_int,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffdc8));
    puVar1 = (ulong *)infinity();
    local_188 = *puVar1 ^ 0x8000000000000000;
    local_98 = local_180;
    local_a0 = &local_188;
    local_a8 = 0;
    local_10 = local_a0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    local_38 = local_e0;
    local_40 = local_180;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffdd0,
               (cpp_dec_float<100U,_int,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffdc8));
  }
  else {
    if (in_ESI == -4) {
LAB_0051f2e3:
      puVar1 = (ulong *)infinity();
      this_00 = (cpp_dec_float<100U,_int,_void> *)(*puVar1 ^ 0x8000000000000000);
      local_68 = &stack0xfffffffffffffdd8;
      local_70 = &stack0xfffffffffffffdd0;
      local_78 = 0;
      local_20 = local_70;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,this_00);
      local_58 = local_e0;
      local_60 = &stack0xfffffffffffffdd8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (this_00,(cpp_dec_float<100U,_int,_void> *)
                         CONCAT44(in_ESI,in_stack_fffffffffffffdc8));
      return;
    }
    if (in_ESI != -2) {
      if (in_ESI == 1) goto LAB_0051f112;
      if (in_ESI == 2) goto LAB_0051f2e3;
      if (in_ESI != 4) {
        return;
      }
    }
    local_88 = infinity();
    local_80 = local_1d8;
    local_90 = 0;
    local_18 = local_88;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    local_48 = local_d8;
    local_50 = local_1d8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffdd0,
               (cpp_dec_float<100U,_int,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffdc8));
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}